

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O3

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,bufref *out)

{
  ulong uVar1;
  uint uVar2;
  ntlmdata *pnVar3;
  CURLcode CVar4;
  char *pcVar5;
  sbyte sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  size_t sVar16;
  ulong __n;
  char *__s;
  uint ntresplen;
  size_t local_948;
  Curl_easy *local_940;
  char *local_938;
  ulong local_930;
  uchar *ntlmv2resp;
  ntlmdata *local_920;
  uchar *local_918;
  long local_910;
  long local_908;
  ulong local_900;
  ulong local_8f8;
  ulong local_8f0;
  ulong local_8e8;
  ulong local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  ulong local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  ulong local_8a8;
  bufref *local_8a0;
  uchar lmbuffer [24];
  uchar ntresp [24];
  uchar lmresp [24];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  local_930 = (ulong)ntlm->flags;
  local_940 = data;
  local_8a0 = out;
  memset(host,0,0x401);
  pcVar5 = strchr(userp,0x5c);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strchr(userp,0x2f);
  }
  uVar10 = (long)pcVar5 - (long)userp;
  __s = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    __s = userp;
  }
  local_938 = userp;
  if (pcVar5 == (char *)0x0) {
    uVar10 = 0;
    local_938 = "";
  }
  local_948 = strlen(__s);
  curl_msnprintf(host,0x401,"%s","WORKSTATION");
  if ((ntlm->flags & 0x80000) == 0) {
    CVar4 = Curl_ntlm_core_mk_nt_hash(passwdp,ntlmbuf);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    Curl_ntlm_core_lm_resp(ntlmbuf,ntlm->nonce,ntresp);
    CVar4 = Curl_ntlm_core_mk_lm_hash(passwdp,lmbuffer);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_918 = ntresp;
    Curl_ntlm_core_lm_resp(lmbuffer,ntlm->nonce,lmresp);
    uVar13 = ntlm->flags & 0xfff7ffff;
    ntlm->flags = uVar13;
    sVar16 = local_948;
    uVar11 = 0x18;
  }
  else {
    CVar4 = Curl_rand(local_940,lmbuffer,8);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_nt_hash(passwdp,ntlmbuf);
    sVar16 = local_948;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_hash(__s,local_948,local_938,uVar10,ntlmbuf,ntresp);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_lmv2_resp(ntresp,lmbuffer,ntlm->nonce,lmresp);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    CVar4 = Curl_ntlm_core_mk_ntlmv2_resp(ntresp,lmbuffer,ntlm,&ntlmv2resp,&ntresplen);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    local_918 = ntlmv2resp;
    uVar13 = ntlm->flags;
    uVar11 = ntresplen;
  }
  uVar1 = local_930 & 1;
  uVar7 = (uint)local_930 & 1;
  local_930 = (ulong)uVar7;
  lVar14 = 0x16;
  if (uVar1 == 0) {
    lVar14 = 0xb;
  }
  sVar6 = (sbyte)uVar7;
  local_908 = sVar16 << sVar6;
  local_910 = uVar10 << sVar6;
  uVar7 = (uint)local_910;
  uVar12 = uVar7 + uVar11 + 0x58;
  uVar2 = (uint)local_908;
  local_8a8 = (ulong)(uVar11 & 0xff);
  local_8d0 = (ulong)(uVar11 >> 8 & 0xff);
  local_8b0 = (ulong)(uVar7 & 0xff);
  local_8b8 = (ulong)(uVar7 >> 8 & 0xff);
  local_8c0 = (ulong)(uVar11 + 0x58 & 0xff);
  local_8c8 = (ulong)(uVar11 + 0x58 >> 8 & 0xff);
  local_8d8 = (ulong)(uVar2 & 0xff);
  local_8e0 = (ulong)(uVar2 >> 8 & 0xff);
  local_8e8 = (ulong)(uVar12 & 0xff);
  local_8f0 = (ulong)(uVar12 >> 8 & 0xff);
  local_8f8 = (ulong)(uVar12 + uVar2 & 0xff);
  local_900 = (ulong)(uVar12 + uVar2 >> 8 & 0xff);
  local_920 = ntlm;
  uVar13 = curl_msnprintf((char *)ntlmbuf,0x400,
                          "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                          ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,local_8a8,local_8d0,local_8a8,local_8d0,
                          0x58,0,0,0,local_8b0,local_8b8,local_8b0,local_8b8,local_8c0,local_8c8,0,0
                          ,local_8d8,local_8e0,local_8d8,local_8e0,local_8e8,local_8f0,0,0,lVar14,0,
                          lVar14,0,local_8f8,local_900,0,0,0,0,0,0,0,0,0,0,(ulong)(uVar13 & 0xff),
                          (ulong)(uVar13 >> 8 & 0xff),(ulong)(uVar13 >> 0x10 & 0xff),
                          (ulong)(uVar13 >> 0x18));
  lVar15 = (long)(int)uVar13;
  if (uVar13 < 1000) {
    *(undefined8 *)(ntlmbuf + lVar15 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + lVar15) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + lVar15 + 8) = lmresp._8_8_;
    lVar15 = lVar15 + 0x18;
  }
  __n = (ulong)ntresplen;
  uVar1 = __n + lVar15;
  if (uVar1 < 0x401) {
    memcpy(ntlmbuf + lVar15,local_918,__n);
    (*Curl_cfree)(ntlmv2resp);
    if (local_908 + lVar14 + local_910 + uVar1 < 0x400) {
      if ((int)local_930 == 0) {
        memcpy(ntlmbuf + uVar1,local_938,uVar10);
        sVar16 = local_948;
        memcpy(ntlmbuf + uVar1 + uVar10,__s,local_948);
        uVar9 = uVar1 + uVar10 + sVar16;
        *(ulong *)(ntlmbuf + uVar9) = CONCAT17(host[7],host._0_7_);
        *(undefined4 *)(ntlmbuf + uVar9 + 7) = host._7_4_;
      }
      else {
        uVar9 = uVar1;
        if ((uVar10 & 0x7fffffffffffffff) != 0) {
          uVar8 = 0;
          do {
            ntlmbuf[uVar8 * 2 + lVar15 + __n] = local_938[uVar8];
            ntlmbuf[uVar8 * 2 + lVar15 + __n + 1] = '\0';
            uVar8 = uVar8 + 1;
            uVar9 = local_910 + uVar1;
          } while ((uVar10 & 0x7fffffffffffffff) != uVar8);
        }
        if ((local_948 & 0x7fffffffffffffff) != 0) {
          uVar10 = 0;
          do {
            ntlmbuf[uVar10 * 2 + uVar9] = __s[uVar10];
            ntlmbuf[uVar10 * 2 + uVar9 + 1] = '\0';
            uVar10 = uVar10 + 1;
          } while ((local_948 & 0x7fffffffffffffff) != uVar10);
          uVar9 = uVar9 + local_908;
        }
        lVar15 = 0;
        do {
          ntlmbuf[lVar15 * 2 + uVar9] = host[lVar15];
          ntlmbuf[lVar15 * 2 + uVar9 + 1] = '\0';
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0xb);
      }
      CVar4 = Curl_bufref_memdup(local_8a0,ntlmbuf,uVar9 + lVar14);
      pnVar3 = local_920;
      (*Curl_cfree)(local_920->target_info);
      pnVar3->target_info = (void *)0x0;
      pnVar3->target_info_len = 0;
      return CVar4;
    }
    pcVar5 = "user + domain + host name too big";
  }
  else {
    pcVar5 = "incoming NTLM message too big";
  }
  Curl_failf(local_940,pcVar5);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             struct bufref *out)
{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

#ifndef NTLM_HOSTNAME
  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }
#else
  (void)msnprintf(host, sizeof(host), "%s", NTLM_HOSTNAME);
  hostlen = sizeof(NTLM_HOSTNAME)-1;
#endif

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    /* Full NTLM version 2
       Although this cannot be negotiated, it is used here if available, as
       servers featuring extended security are likely supporting also
       NTLMv2. */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else {

    unsigned char ntbuffer[0x18];
    unsigned char lmbuffer[0x18];

    /* NTLM version 1 */

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);

    result = Curl_ntlm_core_mk_lm_hash(passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);
    ntlm->flags &= ~NTLMFLAG_NEGOTIATE_NTLM2_KEY;

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.net/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* null-termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,

                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Return the binary blob. */
  result = Curl_bufref_memdup(out, ntlmbuf, size);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}